

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O1

void DivVerifyInt64Int64_2(void)

{
  return;
}

Assistant:

void DivVerifyInt64Int64_2()
{
    TestVector< std::int64_t, std::int64_t, OpType::Div > tests;
    TestCase< std::int64_t, std::int64_t, OpType::Div > test = tests.GetNext();

    while (!tests.Done())
    {
      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::int64_t> si(test.y);
         SafeInt<std::int64_t> si2;

         si2 = test.x / si;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case int64_int64 throw: ", test.x, test.y, test.fExpected );
      }

      tests.GetNext();
   }
}